

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

int Abc_SclFindUpsizes(SC_Man *p,Vec_Int_t *vPathNodes,int Ratio,int Notches,int iIter,int DelayGap,
                      int fMoreConserf)

{
  Abc_Ntk_t *pNtk;
  SC_Lib *pSVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *vNodes;
  SC_Cell *pOld;
  SC_Cell *pCell;
  void *pvVar5;
  uint uVar6;
  SC_Man *pSVar7;
  Vec_Que_t *p_02;
  int iVar8;
  uint uVar9;
  float local_58;
  float dGainBest;
  Vec_Int_t *vEvals;
  Vec_Int_t *vRecalcs;
  
  pSVar7 = p;
  p_00 = Vec_IntAlloc((int)p);
  vRecalcs = p_00;
  p_01 = Vec_IntAlloc((int)pSVar7);
  vEvals = p_01;
  Vec_QueClear(p->vNodeByGain);
  for (iVar8 = 0; iVar8 < vPathNodes->nSize; iVar8 = iVar8 + 1) {
    pNtk = p->pNtk;
    iVar2 = Vec_IntEntry(vPathNodes,iVar8);
    pAVar4 = Abc_NtkObj(pNtk,iVar2);
    if (pAVar4 != (Abc_Obj_t *)0x0) {
      if ((pAVar4->field_0x14 & 0x20) != 0) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                      ,0x263,
                      "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
      }
      iVar2 = Vec_IntEntry(p->vNodeIter,pAVar4->Id);
      if (iVar2 < 0 || iVar2 + 5 <= iIter) {
        Abc_SclFindNodesToUpdate(pAVar4,&vRecalcs,&vEvals,(Abc_Obj_t *)0x0);
        if (p_01->nSize < 1) {
          __assert_fail("Vec_IntSize(vEvals) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                        ,0x269,
                        "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
        }
        iVar2 = Abc_SclFindBestCell(p,pAVar4,p_00,p_01,Notches,DelayGap,&dGainBest);
        if (-1 < iVar2) {
          if (dGainBest <= 0.0) {
            __assert_fail("dGainBest > 0.0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                          ,0x26f,
                          "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
          }
          Vec_FltWriteEntry(p->vNode2Gain,pAVar4->Id,dGainBest);
          Vec_IntWriteEntry(p->vNode2Gate,pAVar4->Id,iVar2);
          Vec_QuePush(p->vNodeByGain,pAVar4->Id);
        }
      }
    }
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  iVar8 = Vec_QueSize(p->vNodeByGain);
  if (iVar8 == 0) {
    uVar3 = 0;
  }
  else {
    p_02 = p->vNodeByGain;
    uVar3 = Vec_QueSize(p_02);
    uVar6 = (uint)((double)vPathNodes->nSize * (double)Ratio * 0.01);
    uVar9 = 1;
    if (1 < (int)uVar6) {
      uVar9 = uVar6;
    }
    if (uVar3 < uVar9) {
      uVar9 = uVar3;
    }
    uVar3 = 0;
    vNodes = Vec_PtrAlloc((int)p_02);
    local_58 = -1.0;
    do {
      do {
        iVar8 = Vec_QueSize(p->vNodeByGain);
        if (iVar8 == 0) goto LAB_003c5bc0;
        iVar8 = Vec_QuePop(p->vNodeByGain);
        pAVar4 = Abc_NtkObj(p->pNtk,iVar8);
        if ((pAVar4->field_0x14 & 0x10) == 0) {
          __assert_fail("pObj->fMarkA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                        ,0x29d,
                        "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
        }
        iVar2 = Abc_SclObjCheckMarkedFanFans(pAVar4);
      } while (iVar2 != 0);
      Abc_SclObjMarkFanFans(pAVar4,vNodes);
      if ((local_58 == -1.0) && (!NAN(local_58))) {
        local_58 = Vec_FltEntry(p->vNode2Gain,iVar8);
      }
      pOld = Abc_SclObjCell(pAVar4);
      pSVar1 = p->pLib;
      iVar8 = Vec_IntEntry(p->vNode2Gate,pAVar4->Id);
      pCell = (SC_Cell *)Vec_PtrEntry(&pSVar1->vCells,iVar8);
      if (pCell == (SC_Cell *)0x0) {
        __assert_fail("pCellNew != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                      ,0x2ab,
                      "int Abc_SclFindUpsizes(SC_Man *, Vec_Int_t *, int, int, int, int, int)");
      }
      p->SumArea = (pCell->area - pOld->area) + p->SumArea;
      Abc_SclObjSetCell(pAVar4,pCell);
      Abc_SclUpdateLoad(p,pAVar4,pOld,pCell);
      Vec_IntPush(p->vUpdates,pAVar4->Id);
      Vec_IntPush(p->vUpdates,pCell->Id);
      Abc_SclTimeIncInsert(p,pAVar4);
      Vec_IntWriteEntry(p->vNodeIter,pAVar4->Id,iIter);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar9);
LAB_003c5bc0:
    iVar8 = vNodes->nSize;
    iVar2 = 0;
    if (iVar8 < 1) {
      iVar8 = 0;
      iVar2 = 0;
    }
    for (; iVar8 != iVar2; iVar2 = iVar2 + 1) {
      pvVar5 = Vec_PtrEntry(vNodes,iVar2);
      *(byte *)((long)pvVar5 + 0x14) = *(byte *)((long)pvVar5 + 0x14) & 0xdf;
    }
    Vec_PtrFree(vNodes);
  }
  return uVar3;
}

Assistant:

int Abc_SclFindUpsizes( SC_Man * p, Vec_Int_t * vPathNodes, int Ratio, int Notches, int iIter, int DelayGap, int fMoreConserf )
{
    SC_Cell * pCellOld, * pCellNew;
    Vec_Int_t * vRecalcs, * vEvals;
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pObj;
    float dGainBest, dGainBest2;
    int i, gateBest, Limit, Counter, iIterLast;

    // compute savings due to upsizing each node
    vRecalcs = Vec_IntAlloc( 100 );
    vEvals = Vec_IntAlloc( 100 );
    Vec_QueClear( p->vNodeByGain );
    Abc_NtkForEachObjVec( vPathNodes, p->pNtk, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        iIterLast = Vec_IntEntry(p->vNodeIter, Abc_ObjId(pObj));
        if ( iIterLast >= 0 && iIterLast + 5 > iIter )
            continue;
        // compute nodes to recalculate timing and nodes to evaluate afterwards
        Abc_SclFindNodesToUpdate( pObj, &vRecalcs, &vEvals, NULL );
        assert( Vec_IntSize(vEvals) > 0 );
        //printf( "%d -> %d\n", Vec_IntSize(vRecalcs), Vec_IntSize(vEvals) );
        gateBest = Abc_SclFindBestCell( p, pObj, vRecalcs, vEvals, Notches, DelayGap, &dGainBest );
        // remember savings
        if ( gateBest >= 0 )
        {
            assert( dGainBest > 0.0 );
            Vec_FltWriteEntry( p->vNode2Gain, Abc_ObjId(pObj), dGainBest );
            Vec_IntWriteEntry( p->vNode2Gate, Abc_ObjId(pObj), gateBest );
            Vec_QuePush( p->vNodeByGain, Abc_ObjId(pObj) );
        }
    }
    Vec_IntFree( vRecalcs );
    Vec_IntFree( vEvals );
    if ( Vec_QueSize(p->vNodeByGain) == 0 )
        return 0;
/*
    Limit = Abc_MinInt( Vec_QueSize(p->vNodeByGain), Abc_MaxInt((int)(0.01 * Ratio * Vec_IntSize(vPathNodes)), 1) ); 
    //printf( "\nSelecting %d out of %d\n", Limit, Vec_QueSize(p->vNodeByGain) );
    for ( i = 0; i < Limit; i++ )
    {
        // get the object
        pObj = Abc_NtkObj( p->pNtk, Vec_QuePop(p->vNodeByGain) );
        assert( pObj->fMarkA );
        // find old and new gates
        pCellOld = Abc_SclObjCell( pObj );
        pCellNew = SC_LibCell( p->pLib, Vec_IntEntry(p->vNode2Gate, Abc_ObjId(pObj)) );
        assert( pCellNew != NULL );
        //printf( "%6d  %20s -> %20s  ", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName );
        //printf( "gain is %f\n", Vec_FltEntry(p->vNode2Gain, Abc_ObjId(pObj)) );
        // update gate
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        p->SumArea += pCellNew->area - pCellOld->area;
        Abc_SclObjSetCell( pObj, pCellNew );
        // record the update
        Vec_IntPush( p->vUpdates, Abc_ObjId(pObj) );
        Vec_IntPush( p->vUpdates, pCellNew->Id );
        Abc_SclTimeIncInsert( p, pObj );
        // remember when this node was upsized
        Vec_IntWriteEntry( p->vNodeIter, Abc_ObjId(pObj), iIter );
    }
return Limit;
*/

    Limit = Abc_MinInt( Vec_QueSize(p->vNodeByGain), Abc_MaxInt((int)(0.01 * Ratio * Vec_IntSize(vPathNodes)), 1) ); 
    dGainBest2 = -1;
    Counter = 0;
    vFanouts = Vec_PtrAlloc( 100 );
    while ( Vec_QueSize(p->vNodeByGain) )
    {
        int iNode = Vec_QuePop(p->vNodeByGain);
        Abc_Obj_t * pObj = Abc_NtkObj( p->pNtk, iNode );
        assert( pObj->fMarkA );
        if ( Abc_SclObjCheckMarkedFanFans( pObj ) )
            continue;
        Abc_SclObjMarkFanFans( pObj, vFanouts );
        // remember gain
        if ( dGainBest2 == -1 )
            dGainBest2 = Vec_FltEntry(p->vNode2Gain, iNode);
//        else if ( dGainBest2 > 3*Vec_FltEntry(p->vNode2Gain, iNode) )
//            break;
//        printf( "%.1f ", Vec_FltEntry(p->vNode2Gain, iNode) );

        // find old and new gates
        pCellOld = Abc_SclObjCell( pObj );
        pCellNew = SC_LibCell( p->pLib, Vec_IntEntry(p->vNode2Gate, Abc_ObjId(pObj)) );
        assert( pCellNew != NULL );
        //printf( "%6d  %20s -> %20s  ", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName );
        //printf( "gain is %f\n", Vec_FltEntry(p->vNode2Gain, Abc_ObjId(pObj)) );
//        if ( pCellOld->Order > 0 )
//            printf( "%.2f  %d -> %d(%d)   ", Vec_FltEntry(p->vNode2Gain, iNode), pCellOld->Order, pCellNew->Order, pCellNew->nGates );
        // update gate
        p->SumArea += pCellNew->area - pCellOld->area;
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // record the update
        Vec_IntPush( p->vUpdates, Abc_ObjId(pObj) );
        Vec_IntPush( p->vUpdates, pCellNew->Id );
        Abc_SclTimeIncInsert( p, pObj );
        // remember when this node was upsized
        Vec_IntWriteEntry( p->vNodeIter, Abc_ObjId(pObj), iIter );
        Counter++;
        if ( Counter == Limit )
            break;
    }
//    printf( "\n" );

    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pObj, i )
        pObj->fMarkB = 0;
    Vec_PtrFree( vFanouts );
    return Counter;
}